

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O2

int cymric_init_(int expected_version)

{
  if (expected_version == 4) {
    m_is_initialized = true;
    return 0;
  }
  return -1;
}

Assistant:

int cymric_init_(int expected_version) {
    if (CYMRIC_VERSION != expected_version)
        return -1;

#ifdef CYMRIC_WINMEM
    static_assert(sizeof(MEMORYSTATUS) <= SEED_SCRATCH_BYTES, "Fix this");
#endif

    m_is_initialized = true;
    return 0;
}